

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O1

void __thiscall
google::protobuf::util::anon_unknown_0::
DescriptorPoolTypeResolverSyntaxTest_EditionsFieldFeatures_Test::TestBody
          (DescriptorPoolTypeResolverSyntaxTest_EditionsFieldFeatures_Test *this)

{
  TypeResolver *pTVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  AlphaNum *in_R8;
  pointer pcVar2;
  char *in_R9;
  pointer *__ptr;
  string_view file_contents;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  Type type;
  undefined1 local_158 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148 [2];
  internal local_128 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  AlphaNum local_118;
  AlphaNum local_e8;
  StatusRep *local_b8;
  string local_b0;
  undefined1 local_90 [128];
  
  file_contents._M_str =
       "\n    package: \"test\"\n    name: \"foo\"\n    syntax: \"editions\"\n    edition: EDITION_2023\n    message_type {\n      name: \"MyMessage\"\n      field {\n        name: \"field\"\n        number: 1\n        type: TYPE_BYTES\n        options {\n          features {\n            [pb.cpp] { string_type: CORD }\n          }\n        }\n      }\n    }\n  "
  ;
  file_contents._M_len = 0x148;
  DescriptorPoolTypeResolverSyntaxTest::BuildFile
            (&this->super_DescriptorPoolTypeResolverSyntaxTest,file_contents);
  Type::Type((Type *)local_90,(Arena *)0x0);
  pTVar1 = (this->super_DescriptorPoolTypeResolverSyntaxTest).resolver_._M_t.
           super___uniq_ptr_impl<google::protobuf::util::TypeResolver,_std::default_delete<google::protobuf::util::TypeResolver>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::TypeResolver_*,_std::default_delete<google::protobuf::util::TypeResolver>_>
           .super__Head_base<0UL,_google::protobuf::util::TypeResolver_*,_false>._M_head_impl;
  local_158 = (undefined1  [8])&DAT_00000013;
  local_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1285da0;
  local_118.piece_._M_len = 1;
  local_118.piece_._M_str = "/";
  local_e8.piece_._M_len = 0xe;
  local_e8.piece_._M_str = "test.MyMessage";
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b0,(lts_20250127 *)local_158,&local_118,&local_e8,in_R8);
  (*pTVar1->_vptr_TypeResolver[2])(&local_b8,pTVar1,&local_b0,local_90);
  local_128[0] = (internal)(local_b8 == (StatusRep *)0x1);
  local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (((ulong)local_b8 & 1) == 0) {
    absl::lts_20250127::status_internal::StatusRep::Unref(local_b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_120;
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,local_128,
               (AssertionResult *)
               "resolver_->ResolveMessageType(GetTypeUrl(\"test.MyMessage\"), &type).ok()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x1f8,(char *)local_158);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if (local_158 != (undefined1  [8])local_148) {
      operator_delete((void *)local_158,local_148[0]._M_allocated_capacity + 1);
    }
    if ((long *)local_118.piece_._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_118.piece_._M_len + 8))();
    }
    __ptr_00 = local_120;
    if (local_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00bdaf07;
  }
  else {
    if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_00,local_120);
    }
    local_118.piece_._M_len = CONCAT44(local_118.piece_._M_len._4_4_,local_90._32_4_);
    local_e8.piece_._M_len = CONCAT44(local_e8.piece_._M_len._4_4_,1);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_158,"type.fields_size()","1",(int *)&local_118,(int *)&local_e8);
    if (local_158[0] == (lts_20250127)0x0) {
      testing::Message::Message((Message *)&local_118);
      if (local_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar2 = (local_150->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x1f9,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_118);
LAB_00bdaed9:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if ((long *)local_118.piece_._M_len != (long *)0x0) {
        (**(code **)(*(long *)local_118.piece_._M_len + 8))();
      }
    }
    else {
      if (local_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_150,local_150);
      }
      local_118.piece_._M_len = 0x1285812;
      protobuf::internal::RepeatedPtrFieldBase::
      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::Field>>
                ((RepeatedPtrFieldBase *)(local_90 + 0x18),0);
      testing::internal::
      PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
                (local_158,(char *)&local_118,(Field *)"type.fields(0)");
      if (local_158[0] == (lts_20250127)0x0) {
        testing::Message::Message((Message *)&local_118);
        if (local_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = anon_var_dwarf_a12c75 + 5;
        }
        else {
          pcVar2 = (local_150->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                   ,0x208,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_118);
        goto LAB_00bdaed9;
      }
    }
    if (local_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00bdaf07;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_150;
    __ptr_00 = local_150;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,__ptr_00);
LAB_00bdaf07:
  Type::~Type((Type *)local_90);
  return;
}

Assistant:

TEST_F(DescriptorPoolTypeResolverSyntaxTest, EditionsFieldFeatures) {
  BuildFile(R"pb(
    package: "test"
    name: "foo"
    syntax: "editions"
    edition: EDITION_2023
    message_type {
      name: "MyMessage"
      field {
        name: "field"
        number: 1
        type: TYPE_BYTES
        options {
          features {
            [pb.cpp] { string_type: CORD }
          }
        }
      }
    }
  )pb");

  Type type;
  ASSERT_TRUE(
      resolver_->ResolveMessageType(GetTypeUrl("test.MyMessage"), &type).ok());
  ASSERT_EQ(type.fields_size(), 1);
  EXPECT_THAT(type.fields(0), EqualsProto(R"pb(
                kind: TYPE_BYTES
                cardinality: CARDINALITY_OPTIONAL
                number: 1
                name: "field"
                options {
                  name: "features"
                  value {
                    [type.googleapis.com/google.protobuf.FeatureSet] {
                      [pb.cpp] { string_type: CORD }
                    }
                  }
                }
                json_name: "field"
              )pb"));
}